

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

uint8_t * __thiscall
google::protobuf::EnumValueOptions::_InternalSerialize
          (EnumValueOptions *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  FeatureSet *value;
  FieldOptions_FeatureSupport *value_00;
  ulong uVar4;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>_>
  *value_01;
  uint8_t *puVar5;
  int index;
  
  uVar2 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar2 & 4) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = (this->field_0)._impl_.deprecated_;
    *target = '\b';
    target[1] = bVar1;
    target = target + 2;
  }
  if ((uVar2 & 1) != 0) {
    value = (this->field_0)._impl_.features_;
    target = protobuf::internal::WireFormatLite::InternalWriteMessage
                       (2,(MessageLite *)value,(value->field_0)._impl_._cached_size_.atom_,target,
                        stream);
  }
  if ((uVar2 & 8) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = (this->field_0)._impl_.debug_redact_;
    *target = '\x18';
    target[1] = bVar1;
    target = target + 2;
  }
  if ((uVar2 & 2) != 0) {
    value_00 = (this->field_0)._impl_.feature_support_;
    target = protobuf::internal::WireFormatLite::InternalWriteMessage
                       (4,(MessageLite *)value_00,*(int *)((long)&value_00->field_0 + 4),target,
                        stream);
  }
  iVar3 = *(int *)((long)&this->field_0 + 0x28);
  if (iVar3 != 0) {
    index = 0;
    do {
      value_01 = protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>>
                           (&(this->field_0)._impl_.uninterpreted_option_.super_RepeatedPtrFieldBase
                            ,index);
      target = protobuf::internal::WireFormatLite::InternalWriteMessage
                         (999,(MessageLite *)value_01,(value_01->field_0)._impl_._cached_size_.atom_
                          ,target,stream);
      index = index + 1;
    } while (iVar3 != index);
  }
  if (*(short *)((long)&this->field_0 + 10) != 0) {
    target = protobuf::internal::ExtensionSet::_InternalSerializeAllImpl
                       (&(this->field_0)._impl_._extensions_,
                        (MessageLite *)_EnumValueOptions_default_instance_,target,stream);
  }
  uVar4 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar4 & 1) == 0) {
    return target;
  }
  puVar5 = protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar4 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar5;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL EnumValueOptions::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const EnumValueOptions& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.EnumValueOptions)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional bool deprecated = 1 [default = false];
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        1, this_._internal_deprecated(), target);
  }

  // optional .google.protobuf.FeatureSet features = 2;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        2, *this_._impl_.features_, this_._impl_.features_->GetCachedSize(), target,
        stream);
  }

  // optional bool debug_redact = 3 [default = false];
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        3, this_._internal_debug_redact(), target);
  }

  // optional .google.protobuf.FieldOptions.FeatureSupport feature_support = 4;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        4, *this_._impl_.feature_support_, this_._impl_.feature_support_->GetCachedSize(), target,
        stream);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_uninterpreted_option_size());
       i < n; i++) {
    const auto& repfield = this_._internal_uninterpreted_option().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            999, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // All extensions.
  target = this_._impl_._extensions_._InternalSerializeAll(&default_instance(),
                                                    target, stream);
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.EnumValueOptions)
  return target;
}